

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Settings.cpp
# Opt level: O0

string * Settings::fileToFix_abi_cxx11_(int n)

{
  reference pvVar1;
  int in_ESI;
  string *in_RDI;
  
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)files_abi_cxx11_,(long)in_ESI);
  std::__cxx11::string::string((string *)in_RDI,(string *)pvVar1);
  return in_RDI;
}

Assistant:

std::string fileToFix(const int n){ return files[n]; }